

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O3

VerifyEcdsaAdaptorRequestStruct * __thiscall
cfd::js::api::json::VerifyEcdsaAdaptorRequest::ConvertToStruct
          (VerifyEcdsaAdaptorRequestStruct *__return_storage_ptr__,VerifyEcdsaAdaptorRequest *this)

{
  VerifyEcdsaAdaptorRequestStruct::VerifyEcdsaAdaptorRequestStruct(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->proof);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->adaptor);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->message);
  __return_storage_ptr__->is_hashed = this->is_hashed_;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->pubkey);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

VerifyEcdsaAdaptorRequestStruct VerifyEcdsaAdaptorRequest::ConvertToStruct() const {  // NOLINT
  VerifyEcdsaAdaptorRequestStruct result;
  result.adaptor_signature = adaptor_signature_;
  result.proof = proof_;
  result.adaptor = adaptor_;
  result.message = message_;
  result.is_hashed = is_hashed_;
  result.pubkey = pubkey_;
  result.ignore_items = ignore_items;
  return result;
}